

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Document::parseDirectives(Document *this)

{
  bool bVar1;
  Token *pTVar2;
  bool bVar3;
  undefined1 local_68 [8];
  Token T;
  
  bVar3 = false;
  do {
    pTVar2 = peekNext(this);
    Token::Token((Token *)local_68,pTVar2);
    if (local_68._0_4_ == TK_VersionDirective) {
      bVar3 = true;
      parseYAMLDirective(this);
      bVar1 = true;
    }
    else if (local_68._0_4_ == TK_TagDirective) {
      bVar3 = true;
      parseTAGDirective(this);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&T.Range.Length);
  } while (bVar1);
  return bVar3;
}

Assistant:

bool Document::parseDirectives() {
  bool isDirective = false;
  while (true) {
    Token T = peekNext();
    if (T.Kind == Token::TK_TagDirective) {
      parseTAGDirective();
      isDirective = true;
    } else if (T.Kind == Token::TK_VersionDirective) {
      parseYAMLDirective();
      isDirective = true;
    } else
      break;
  }
  return isDirective;
}